

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall
TTD::ThreadContextTTD::SyncCtxtsAndRootsWithSnapshot_Replay
          (ThreadContextTTD *this,uint32 liveContextCount,TTD_LOG_PTR_ID *liveContextIdArray,
          uint32 liveRootCount,TTD_LOG_PTR_ID *liveRootIdArray)

{
  BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Type *pTVar1;
  uint uVar2;
  Type pSVar3;
  DictionaryStats *this_01;
  bool bVar4;
  uint uVar5;
  Type *ppSVar6;
  FinalizableObject *obj;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int nextIndex;
  int index;
  undefined1 auStack_c8 [8];
  BaseHashSet<unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_long,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  lctxSet;
  undefined1 auStack_88 [8];
  BaseHashSet<unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_long,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  refInfoMap;
  Type local_38;
  ScriptContext *ctx;
  
  auStack_c8 = (undefined1  [8])0x0;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .buckets = (Type)0x0;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .entries = (Type)&Memory::HeapAllocator::Instance;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .alloc = (Type)0x0;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .size = 0;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .count = 0;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeList = 0x4b;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeCount = 0;
  lctxSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .modFunctionIndex = 0;
  if (liveContextCount != 0) {
    uVar8 = (ulong)liveContextCount;
    do {
      auStack_88 = (undefined1  [8])*liveContextIdArray;
      JsUtil::
      BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  *)auStack_c8,(unsigned_long *)auStack_88,liveContextIdArray);
      liveContextIdArray = liveContextIdArray + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if (0 < (this->m_contextList).
          super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count) {
    refInfoMap.
    super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    .stats = (Type)&(this->m_contextList).field_0x28;
    index = 0;
    do {
      ppSVar6 = JsUtil::
                List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(&this->m_contextList,index);
      local_38 = *ppSVar6;
      auStack_88 = (undefined1  [8])local_38->ScriptContextLogTag;
      bVar4 = JsUtil::
              BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)auStack_c8,(unsigned_long *)auStack_88);
      if (bVar4) {
        index = index + 1;
      }
      else {
        this->m_contextCreatedOrDestoyedInReplay = true;
        Js::
        CopyRemovePolicy<JsUtil::List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
        ::Remove((CopyRemovePolicy<JsUtil::List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                  *)refInfoMap.
                    super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    .stats,&this->m_contextList,&local_38);
        obj = JsUtil::
              BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Item(&this->m_ttdContextToExternalRefMap,&local_38);
        JsUtil::
        BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Remove(&this->m_ttdContextToExternalRefMap,&local_38);
        Memory::Recycler::RootRelease(this->m_threadCtx->recycler,obj,(uint *)0x0);
      }
    } while (index < (this->m_contextList).
                     super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                     .count);
  }
  auStack_88 = (undefined1  [8])0x0;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .buckets = (Type)0x0;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .entries = (Type)&Memory::HeapAllocator::Instance;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .alloc = (Type)0x0;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .size = 0;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .count = 0;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeList = 0x4b;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeCount = 0;
  refInfoMap.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .modFunctionIndex = 0;
  if (liveRootCount != 0) {
    uVar8 = (ulong)liveRootCount;
    do {
      local_38 = (Type)*liveRootIdArray;
      JsUtil::
      BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  *)auStack_88,(unsigned_long *)&local_38,liveRootIdArray);
      liveRootIdArray = liveRootIdArray + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  uVar5 = (this->m_ttdMayBeLongLivedRoot).bucketCount;
  if (uVar5 != 0) {
    this_00 = &this->m_ttdMayBeLongLivedRoot;
    uVar8 = 0;
    do {
      if (this_00->buckets[uVar8] != 0xffffffff) {
        refInfoMap.
        super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        .stats = (Type)(uVar8 * 4);
        uVar9 = 0xffffffff;
        uVar5 = this_00->buckets[uVar8];
        do {
          uVar10 = (ulong)uVar5;
          local_38 = (Type)(this->m_ttdMayBeLongLivedRoot).entries[(int)uVar5].
                           super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .super_KeyValueEntry<unsigned_long,_bool>.
                           super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                           .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key;
          bVar4 = JsUtil::
                  BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::ContainsKey((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 *)auStack_88,(unsigned_long *)&local_38);
          pSVar3 = (this->m_ttdMayBeLongLivedRoot).entries;
          uVar2 = pSVar3[(int)uVar5].
                  super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_long,_bool>.
                  super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                  .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
          if (!bVar4) {
            piVar7 = &pSVar3[uVar9].
                      super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .super_KeyValueEntry<unsigned_long,_bool>.
                      super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                      .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
            if ((int)uVar9 < 0) {
              piVar7 = (int *)((long)&(refInfoMap.
                                       super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                      .stats)->pNext + (long)(this->m_ttdMayBeLongLivedRoot).buckets
                              );
            }
            *piVar7 = uVar2;
            pSVar3[(int)uVar5].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.value = false;
            pSVar3[(int)uVar5].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key = 0;
            JsUtil::
            BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::SetNextFreeEntryIndex
                      (this_00,pSVar3 + (int)uVar5,
                       -(uint)((this->m_ttdMayBeLongLivedRoot).freeCount == 0) |
                       (this->m_ttdMayBeLongLivedRoot).freeList);
            (this->m_ttdMayBeLongLivedRoot).freeList = uVar5;
            pTVar1 = &(this->m_ttdMayBeLongLivedRoot).freeCount;
            *pTVar1 = *pTVar1 + 1;
            this_01 = (this->m_ttdMayBeLongLivedRoot).stats;
            uVar10 = uVar9;
            if (this_01 != (DictionaryStats *)0x0) {
              DictionaryStats::Remove(this_01,this_00->buckets[uVar8] == -1);
            }
          }
          uVar9 = uVar10;
          uVar5 = uVar2;
        } while (uVar2 != 0xffffffff);
        uVar5 = (this->m_ttdMayBeLongLivedRoot).bucketCount;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar5);
  }
  ClearLocalRootsAndRefreshMap_Replay(this);
  JsUtil::
  BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)auStack_88);
  JsUtil::
  BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)auStack_c8);
  return;
}

Assistant:

void ThreadContextTTD::SyncCtxtsAndRootsWithSnapshot_Replay(uint32 liveContextCount, TTD_LOG_PTR_ID* liveContextIdArray, uint32 liveRootCount, TTD_LOG_PTR_ID* liveRootIdArray)
    {
        //First sync up the context list -- releasing any contexts that are not also there in our initial recording
        JsUtil::BaseHashSet<TTD_LOG_PTR_ID, HeapAllocator> lctxSet(&HeapAllocator::Instance);
        for(uint32 i = 0; i < liveContextCount; ++i)
        {
            lctxSet.AddNew(liveContextIdArray[i]);
        }

        int32 ctxpos = 0;
        while(ctxpos < this->m_contextList.Count())
        {
            Js::ScriptContext* ctx = this->m_contextList.Item(ctxpos);

            if(lctxSet.Contains(ctx->ScriptContextLogTag))
            {
                ctxpos++;
            }
            else
            {
                this->m_contextCreatedOrDestoyedInReplay = true;

                this->m_contextList.Remove(ctx);

                FinalizableObject* externalCtx = this->m_ttdContextToExternalRefMap.Item(ctx);
                this->m_ttdContextToExternalRefMap.Remove(ctx);

                this->m_threadCtx->GetRecycler()->RootRelease(externalCtx);

                //no inc of ctxpos since list go shorter!!!
            }
        }

        //Now sync up the root list wrt. long lived roots that we recorded
        JsUtil::BaseHashSet<TTD_LOG_PTR_ID, HeapAllocator> refInfoMap(&HeapAllocator::Instance);
        for(uint32 i = 0; i < liveRootCount; ++i)
        {
            refInfoMap.AddNew(liveRootIdArray[i]);
        }

        this->m_ttdMayBeLongLivedRoot.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, bool>& entry) -> bool
        {
            return !refInfoMap.Contains(entry.Key());
        });

        this->ClearLocalRootsAndRefreshMap_Replay();
    }